

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O1

int32_t __thiscall
icu_63::UnicodeString::indexOf
          (UnicodeString *this,UChar *srcChars,int32_t srcStart,int32_t srcLength,int32_t start,
          int32_t length)

{
  ushort uVar1;
  int iVar2;
  int length_00;
  UChar *pUVar3;
  uint uVar4;
  int iVar5;
  char16_t *pcVar6;
  
  uVar4 = 0xffffffff;
  if ((((srcLength != 0) && (-1 < srcStart)) && (srcChars != (UChar *)0x0)) &&
     ((uVar1 = (this->fUnion).fStackFields.fLengthAndFlags, (uVar1 & 1) == 0 &&
      ((-1 < srcLength || (srcChars[(uint)srcStart] != L'\0')))))) {
    if ((short)uVar1 < 0) {
      iVar2 = (this->fUnion).fFields.fLength;
    }
    else {
      iVar2 = (int)(short)uVar1 >> 5;
    }
    iVar5 = start;
    if (iVar2 < start) {
      iVar5 = iVar2;
    }
    if (start < 0) {
      iVar5 = 0;
    }
    length_00 = iVar2 - iVar5;
    if (length <= iVar2 - iVar5) {
      length_00 = length;
    }
    if (length < 0) {
      length_00 = 0;
    }
    if ((uVar1 & 2) == 0) {
      pcVar6 = (this->fUnion).fFields.fArray;
    }
    else {
      pcVar6 = (char16_t *)((long)&this->fUnion + 2);
    }
    pUVar3 = u_strFindFirst_63(pcVar6 + iVar5,length_00,srcChars + (uint)srcStart,srcLength);
    uVar4 = -(uint)(pUVar3 == (UChar *)0x0) | (uint)((ulong)((long)pUVar3 - (long)pcVar6) >> 1);
  }
  return uVar4;
}

Assistant:

int32_t 
UnicodeString::indexOf(const UChar *srcChars,
               int32_t srcStart,
               int32_t srcLength,
               int32_t start,
               int32_t length) const
{
  if(isBogus() || srcChars == 0 || srcStart < 0 || srcLength == 0) {
    return -1;
  }

  // UnicodeString does not find empty substrings
  if(srcLength < 0 && srcChars[srcStart] == 0) {
    return -1;
  }

  // get the indices within bounds
  pinIndices(start, length);

  // find the first occurrence of the substring
  const UChar *array = getArrayStart();
  const UChar *match = u_strFindFirst(array + start, length, srcChars + srcStart, srcLength);
  if(match == NULL) {
    return -1;
  } else {
    return (int32_t)(match - array);
  }
}